

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Cluster::GetNext(Cluster *this,BlockEntry *pCurr,BlockEntry **pNext)

{
  ulong uVar1;
  ulong uVar2;
  BlockEntry *pBVar3;
  BlockEntry **ppBVar4;
  long lVar5;
  long len;
  longlong pos;
  long local_30;
  longlong local_28;
  
  if (pCurr == (BlockEntry *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cd4,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  ppBVar4 = this->m_entries;
  if (ppBVar4 == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cd5,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  uVar1 = this->m_entries_count;
  if ((long)uVar1 < 1) {
    __assert_fail("m_entries_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cd6,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  uVar2 = pCurr->m_index;
  if (uVar1 <= uVar2) {
    __assert_fail("idx < size_t(m_entries_count)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cd9,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  if (ppBVar4[uVar2] != pCurr) {
    __assert_fail("m_entries[idx] == pCurr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cda,
                  "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const")
    ;
  }
  if (uVar2 + 1 < uVar1) {
LAB_0012b4e4:
    pBVar3 = ppBVar4[uVar2 + 1];
    *pNext = pBVar3;
    if (pBVar3 == (BlockEntry *)0x0) {
      __assert_fail("pNext",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1cf4,
                    "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                   );
    }
    lVar5 = 0;
  }
  else {
    lVar5 = Parse(this,&local_28,&local_30);
    if (-1 < lVar5) {
      if (lVar5 == 0) {
        ppBVar4 = this->m_entries;
        if (ppBVar4 == (BlockEntry **)0x0) {
          __assert_fail("m_entries",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1cee,
                        "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                       );
        }
        if (this->m_entries_count < 1) {
          __assert_fail("m_entries_count > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1cef,
                        "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                       );
        }
        if ((ulong)this->m_entries_count <= uVar2 + 1) {
          __assert_fail("idx < size_t(m_entries_count)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1cf0,
                        "long mkvparser::Cluster::GetNext(const BlockEntry *, const BlockEntry *&) const"
                       );
        }
        goto LAB_0012b4e4;
      }
      lVar5 = 0;
    }
    *pNext = (BlockEntry *)0x0;
  }
  return lVar5;
}

Assistant:

long Cluster::GetNext(const BlockEntry* pCurr, const BlockEntry*& pNext) const {
  assert(pCurr);
  assert(m_entries);
  assert(m_entries_count > 0);

  size_t idx = pCurr->GetIndex();
  assert(idx < size_t(m_entries_count));
  assert(m_entries[idx] == pCurr);

  ++idx;

  if (idx >= size_t(m_entries_count)) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pNext = NULL;
      return status;
    }

    if (status > 0) {
      pNext = NULL;
      return 0;
    }

    assert(m_entries);
    assert(m_entries_count > 0);
    assert(idx < size_t(m_entries_count));
  }

  pNext = m_entries[idx];
  assert(pNext);

  return 0;
}